

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::replace_extension(path *this,path *replacement)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  undefined8 uVar5;
  _Alloc_hider _Var6;
  ulong uVar7;
  path local_40;
  
  bVar4 = has_extension(this);
  if (bVar4) {
    sVar2 = (this->_path)._M_string_length;
    extension(&local_40,this);
    uVar7 = sVar2 - local_40._path._M_string_length;
    if ((this->_path)._M_string_length < uVar7) {
      uVar5 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase",uVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._path._M_dataplus._M_p != &local_40._path.field_2) {
        operator_delete(local_40._path._M_dataplus._M_p,
                        local_40._path.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar5);
    }
    (this->_path)._M_string_length = uVar7;
    (this->_path)._M_dataplus._M_p[uVar7] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._path._M_dataplus._M_p != &local_40._path.field_2) {
      operator_delete(local_40._path._M_dataplus._M_p,
                      local_40._path.field_2._M_allocated_capacity + 1);
    }
  }
  if (((replacement->_path)._M_string_length != 0) &&
     (*(replacement->_path)._M_dataplus._M_p != '.')) {
    std::__cxx11::string::push_back((char)this);
  }
  paVar1 = &local_40._path.field_2;
  pcVar3 = (replacement->_path)._M_dataplus._M_p;
  local_40._path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar3,pcVar3 + (replacement->_path)._M_string_length);
  _Var6._M_p = local_40._path._M_dataplus._M_p;
  std::__cxx11::string::_M_append((char *)this,(ulong)local_40._path._M_dataplus._M_p);
  postprocess_path_with_format(this,(format)_Var6._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._path._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._path._M_dataplus._M_p,local_40._path.field_2._M_allocated_capacity + 1
                   );
  }
  return this;
}

Assistant:

GHC_INLINE path& path::replace_extension(const path& replacement)
{
    if (has_extension()) {
        _path.erase(_path.size() - extension()._path.size());
    }
    if (!replacement.empty() && replacement._path[0] != '.') {
        _path += '.';
    }
    return concat(replacement);
}